

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeEnd::pumpTo(WebSocketPipeEnd *this,WebSocket *other)

{
  WebSocket *pWVar1;
  Maybe<kj::WebSocket_&> *pMVar2;
  void *pvVar3;
  _func_int **in_RDX;
  AttachmentPromiseNodeBase *this_00;
  DebugComparison<kj::Maybe<kj::WebSocket_&>_&,_const_kj::None_&> _kjCondition;
  Fault f;
  
  pWVar1 = (WebSocket *)other[2]._vptr_WebSocket;
  _kjCondition.left = (Maybe<kj::WebSocket_&> *)(pWVar1 + 3);
  _kjCondition.result = pWVar1[3]._vptr_WebSocket == (_func_int **)0x0;
  _kjCondition.right = (None *)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    pWVar1[3]._vptr_WebSocket = in_RDX;
    WebSocketPipeImpl::pumpTo((WebSocketPipeImpl *)&_kjCondition,pWVar1);
    pMVar2 = _kjCondition.left;
    pWVar1 = _kjCondition.left[1].ptr;
    if (pWVar1 == (WebSocket *)0x0 || (ulong)((long)_kjCondition.left - (long)pWVar1) < 0x28) {
      pvVar3 = operator_new(0x400);
      this_00 = (AttachmentPromiseNodeBase *)((long)pvVar3 + 0x3d8);
      kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
                (this_00,(OwnPromiseNode *)&_kjCondition);
      *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_0061b0c0;
      *(undefined1 *)((long)pvVar3 + 0x3f0) = 1;
      *(WebSocket **)((long)pvVar3 + 0x3f8) = other;
      *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
    }
    else {
      _kjCondition.left[1].ptr = (WebSocket *)0x0;
      this_00 = (AttachmentPromiseNodeBase *)(_kjCondition.left + -5);
      kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
                (this_00,(OwnPromiseNode *)&_kjCondition);
      pMVar2[-5].ptr = (WebSocket *)&PTR_destroy_0061b0c0;
      *(undefined1 *)&pMVar2[-2].ptr = 1;
      pMVar2[-1].ptr = other;
      pMVar2[-4].ptr = pWVar1;
    }
    pMVar2 = _kjCondition.left;
    (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
    if (_kjCondition.left != (Maybe<kj::WebSocket_&> *)0x0) {
      _kjCondition.left = (Maybe<kj::WebSocket_&> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pMVar2);
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::WebSocket&>&,kj::None_const&>&,char_const(&)[38]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1188,FAILED,"in->destinationPumpingTo == kj::none",
             "_kjCondition,\"can only call pumpTo() once at a time\"",&_kjCondition,
             (char (*) [38])"can only call pumpTo() once at a time");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
    KJ_REQUIRE(in->destinationPumpingTo == kj::none, "can only call pumpTo() once at a time");
    // By convention, we store the WebSocket reference on `in`.
    in->destinationPumpingTo = other;
    auto deferredUnregister = kj::defer([this]() { in->destinationPumpingTo = kj::none; });
    return in->pumpTo(other).attach(kj::mv(deferredUnregister));
  }